

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysis.h
# Opt level: O2

void __thiscall dg::DGLLVMPointerAnalysis::initialize(DGLLVMPointerAnalysis *this)

{
  LLVMPointerAnalysisOptions *opts;
  AnalysisType AVar1;
  PointerAnalysis *pPVar2;
  DGLLVMPointerAnalysisImpl<dg::pta::PointerAnalysisFI> *this_00;
  
  if ((this->super_LLVMPointerAnalysis).options.analysisType == inv) {
    ((this->_builder)._M_t.
     super___uniq_ptr_impl<dg::pta::LLVMPointerGraphBuilder,_std::default_delete<dg::pta::LLVMPointerGraphBuilder>_>
     ._M_t.
     super__Tuple_impl<0UL,_dg::pta::LLVMPointerGraphBuilder_*,_std::default_delete<dg::pta::LLVMPointerGraphBuilder>_>
     .super__Head_base<0UL,_dg::pta::LLVMPointerGraphBuilder_*,_false>._M_head_impl)->
    invalidate_nodes = true;
  }
  opts = &(this->super_LLVMPointerAnalysis).options;
  buildSubgraph(this);
  AVar1 = (this->super_LLVMPointerAnalysis).options.analysisType;
  if (AVar1 == fi) {
    this_00 = (DGLLVMPointerAnalysisImpl<dg::pta::PointerAnalysisFI> *)operator_new(0xa8);
    DGLLVMPointerAnalysisImpl<dg::pta::PointerAnalysisFI>::DGLLVMPointerAnalysisImpl
              (this_00,this->PS,
               (this->_builder)._M_t.
               super___uniq_ptr_impl<dg::pta::LLVMPointerGraphBuilder,_std::default_delete<dg::pta::LLVMPointerGraphBuilder>_>
               ._M_t.
               super__Tuple_impl<0UL,_dg::pta::LLVMPointerGraphBuilder_*,_std::default_delete<dg::pta::LLVMPointerGraphBuilder>_>
               .super__Head_base<0UL,_dg::pta::LLVMPointerGraphBuilder_*,_false>._M_head_impl,opts);
  }
  else if (AVar1 == inv) {
    this_00 = (DGLLVMPointerAnalysisImpl<dg::pta::PointerAnalysisFI> *)operator_new(0xa8);
    DGLLVMPointerAnalysisImpl<dg::pta::PointerAnalysisFSInv>::DGLLVMPointerAnalysisImpl
              ((DGLLVMPointerAnalysisImpl<dg::pta::PointerAnalysisFSInv> *)this_00,this->PS,
               (this->_builder)._M_t.
               super___uniq_ptr_impl<dg::pta::LLVMPointerGraphBuilder,_std::default_delete<dg::pta::LLVMPointerGraphBuilder>_>
               ._M_t.
               super__Tuple_impl<0UL,_dg::pta::LLVMPointerGraphBuilder_*,_std::default_delete<dg::pta::LLVMPointerGraphBuilder>_>
               .super__Head_base<0UL,_dg::pta::LLVMPointerGraphBuilder_*,_false>._M_head_impl,opts);
  }
  else {
    if (AVar1 != fs) {
      abort();
    }
    this_00 = (DGLLVMPointerAnalysisImpl<dg::pta::PointerAnalysisFI> *)operator_new(0xa8);
    DGLLVMPointerAnalysisImpl<dg::pta::PointerAnalysisFS>::DGLLVMPointerAnalysisImpl
              ((DGLLVMPointerAnalysisImpl<dg::pta::PointerAnalysisFS> *)this_00,this->PS,
               (this->_builder)._M_t.
               super___uniq_ptr_impl<dg::pta::LLVMPointerGraphBuilder,_std::default_delete<dg::pta::LLVMPointerGraphBuilder>_>
               ._M_t.
               super__Tuple_impl<0UL,_dg::pta::LLVMPointerGraphBuilder_*,_std::default_delete<dg::pta::LLVMPointerGraphBuilder>_>
               .super__Head_base<0UL,_dg::pta::LLVMPointerGraphBuilder_*,_false>._M_head_impl,opts);
  }
  pPVar2 = (this->PTA)._M_t.
           super___uniq_ptr_impl<dg::pta::PointerAnalysis,_std::default_delete<dg::pta::PointerAnalysis>_>
           ._M_t.
           super__Tuple_impl<0UL,_dg::pta::PointerAnalysis_*,_std::default_delete<dg::pta::PointerAnalysis>_>
           .super__Head_base<0UL,_dg::pta::PointerAnalysis_*,_false>._M_head_impl;
  (this->PTA)._M_t.
  super___uniq_ptr_impl<dg::pta::PointerAnalysis,_std::default_delete<dg::pta::PointerAnalysis>_>.
  _M_t.
  super__Tuple_impl<0UL,_dg::pta::PointerAnalysis_*,_std::default_delete<dg::pta::PointerAnalysis>_>
  .super__Head_base<0UL,_dg::pta::PointerAnalysis_*,_false>._M_head_impl =
       (PointerAnalysis *)this_00;
  if (pPVar2 != (PointerAnalysis *)0x0) {
    (*pPVar2->_vptr_PointerAnalysis[1])();
    return;
  }
  return;
}

Assistant:

void initialize() {
        if (options.isFSInv())
            _builder->setInvalidateNodesFlag(true);

        buildSubgraph();

        if (options.isFS()) {
            // FIXME: make a interface with run() method
            PTA.reset(new DGLLVMPointerAnalysisImpl<pta::PointerAnalysisFS>(
                    PS, _builder.get(), options));
        } else if (options.isFI()) {
            PTA.reset(new DGLLVMPointerAnalysisImpl<pta::PointerAnalysisFI>(
                    PS, _builder.get(), options));
        } else if (options.isFSInv()) {
            PTA.reset(new DGLLVMPointerAnalysisImpl<pta::PointerAnalysisFSInv>(
                    PS, _builder.get(), options));
        } else {
            assert(0 && "Wrong pointer analysis");
            abort();
        }
    }